

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::Statements(SQCompiler *this)

{
  long lVar1;
  
  while ((1 < this->_token - 300U && (this->_token != 0x7d))) {
    Statement(this,true);
    lVar1 = (this->_lex)._prevtoken;
    if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
      OptionalSemicolon(this);
    }
  }
  return;
}

Assistant:

void Statements()
    {
        while(_token != _SC('}') && _token != TK_DEFAULT && _token != TK_CASE) {
            Statement();
            if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
    }